

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

bool __thiscall
CppJieba::HMMSegment::cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  bool bVar1;
  string *res_00;
  string *psVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SegmentBase *in_RDI;
  uint i;
  string tmp;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *in_stack_00000040;
  HMMSegment *in_stack_00000048;
  const_iterator in_stack_00000050;
  const_iterator in_stack_00000058;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  words;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint local_84;
  string local_80 [32];
  undefined4 local_60;
  undefined8 local_50;
  undefined8 local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  undefined8 local_18;
  undefined8 local_10;
  byte local_1;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = SegmentBase::_getInitFlag(in_RDI);
  if (bVar1) {
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
    if (bVar1) {
      local_1 = 0;
    }
    else {
      this_00 = &local_40;
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                *)0x12f297);
      local_48 = local_10;
      local_50 = local_18;
      bVar1 = cut(in_stack_00000048,in_stack_00000058,in_stack_00000050,in_stack_00000040);
      if (bVar1) {
        std::__cxx11::string::string(local_80);
        local_84 = 0;
        while( true ) {
          res_00 = (string *)(ulong)local_84;
          psVar2 = (string *)
                   std::
                   vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ::size((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           *)&local_40);
          if (psVar2 <= res_00) break;
          std::
          vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ::operator[]((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        *)&local_40,(ulong)local_84);
          bVar1 = TransCode::encode((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                    this_00,res_00);
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_00,res_00);
          }
          local_84 = local_84 + 1;
        }
        local_1 = 1;
        local_60 = 1;
        std::__cxx11::string::~string(local_80);
      }
      else {
        local_1 = 0;
        local_60 = 1;
      }
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 *)this_00);
    }
    return (bool)(local_1 & 1);
  }
  __assert_fail("_getInitFlag()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                ,0x5d,
                "virtual bool CppJieba::HMMSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
               );
}

Assistant:

virtual bool cut(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<Unicode> words;
                if(!cut(begin, end, words))
                {
                    return false;
                }
                string tmp;
                for(uint i = 0; i < words.size(); i++)
                {
                    if(TransCode::encode(words[i], tmp))
                    {
                        res.push_back(tmp);
                    }
                }
                return true;
            }